

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000176650 = 0x2e2e2e2e2e2e2e;
    uRam0000000000176657._0_1_ = '.';
    uRam0000000000176657._1_1_ = '.';
    uRam0000000000176657._2_1_ = '.';
    uRam0000000000176657._3_1_ = '.';
    uRam0000000000176657._4_1_ = '.';
    uRam0000000000176657._5_1_ = '.';
    uRam0000000000176657._6_1_ = '.';
    uRam0000000000176657._7_1_ = '.';
    DAT_00176640 = '.';
    DAT_00176640_1._0_1_ = '.';
    DAT_00176640_1._1_1_ = '.';
    DAT_00176640_1._2_1_ = '.';
    DAT_00176640_1._3_1_ = '.';
    DAT_00176640_1._4_1_ = '.';
    DAT_00176640_1._5_1_ = '.';
    DAT_00176640_1._6_1_ = '.';
    uRam0000000000176648 = 0x2e2e2e2e2e2e2e;
    DAT_0017664f = 0x2e;
    DAT_00176630 = '.';
    DAT_00176630_1._0_1_ = '.';
    DAT_00176630_1._1_1_ = '.';
    DAT_00176630_1._2_1_ = '.';
    DAT_00176630_1._3_1_ = '.';
    DAT_00176630_1._4_1_ = '.';
    DAT_00176630_1._5_1_ = '.';
    DAT_00176630_1._6_1_ = '.';
    uRam0000000000176638._0_1_ = '.';
    uRam0000000000176638._1_1_ = '.';
    uRam0000000000176638._2_1_ = '.';
    uRam0000000000176638._3_1_ = '.';
    uRam0000000000176638._4_1_ = '.';
    uRam0000000000176638._5_1_ = '.';
    uRam0000000000176638._6_1_ = '.';
    uRam0000000000176638._7_1_ = '.';
    DAT_00176620 = '.';
    DAT_00176620_1._0_1_ = '.';
    DAT_00176620_1._1_1_ = '.';
    DAT_00176620_1._2_1_ = '.';
    DAT_00176620_1._3_1_ = '.';
    DAT_00176620_1._4_1_ = '.';
    DAT_00176620_1._5_1_ = '.';
    DAT_00176620_1._6_1_ = '.';
    uRam0000000000176628._0_1_ = '.';
    uRam0000000000176628._1_1_ = '.';
    uRam0000000000176628._2_1_ = '.';
    uRam0000000000176628._3_1_ = '.';
    uRam0000000000176628._4_1_ = '.';
    uRam0000000000176628._5_1_ = '.';
    uRam0000000000176628._6_1_ = '.';
    uRam0000000000176628._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000176618._0_1_ = '.';
    uRam0000000000176618._1_1_ = '.';
    uRam0000000000176618._2_1_ = '.';
    uRam0000000000176618._3_1_ = '.';
    uRam0000000000176618._4_1_ = '.';
    uRam0000000000176618._5_1_ = '.';
    uRam0000000000176618._6_1_ = '.';
    uRam0000000000176618._7_1_ = '.';
    DAT_0017665f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }